

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void __thiscall
crnlib::
hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
::move_into(hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
            *this,node *pNode)

{
  uint8 uVar1;
  uint index_00;
  uint uVar2;
  node *pnStack_28;
  int orig_index;
  node *pDst_node;
  int index;
  node *pNode_local;
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *this_local;
  
  index_00 = hash_key(this,(vec<2U,_float> *)pNode);
  pnStack_28 = get_node(this,index_00);
  uVar1 = pnStack_28->state;
  pDst_node._4_4_ = index_00;
  while( true ) {
    if (uVar1 == '\0') {
      move_node(pnStack_28,pNode);
      this->m_num_valid = this->m_num_valid + 1;
      return;
    }
    if (pDst_node._4_4_ == 0) {
      uVar2 = vector<crnlib::hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>::raw_node>
              ::size(&this->m_values);
      pDst_node._4_4_ = uVar2 - 1;
      pnStack_28 = get_node(this,pDst_node._4_4_);
    }
    else {
      pDst_node._4_4_ = pDst_node._4_4_ - 1;
      pnStack_28 = pnStack_28 + -1;
    }
    if (pDst_node._4_4_ == index_00) break;
    uVar1 = pnStack_28->state;
  }
  return;
}

Assistant:

inline void move_into(node* pNode)
        {
            int index = hash_key(pNode->first);
            node* pDst_node = &get_node(index);

            if (pDst_node->state)
            {
                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pDst_node = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pDst_node--;
                    }

                    if (index == orig_index)
                    {
                        CRNLIB_ASSERT(false);
                        return;
                    }

                    if (!pDst_node->state)
                    {
                        break;
                    }
                }
            }

            move_node(pDst_node, pNode);

            m_num_valid++;
        }